

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

nullable_omittable_field<int> * __thiscall
discordpp::nullable_omittable_field<int>::operator=(nullable_omittable_field<int> *this)

{
  _Head_base<0UL,_int_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  (this->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  if (_Var1._M_head_impl != (int *)0x0) {
    operator_delete(_Var1._M_head_impl,4);
  }
  (this->super_field<int>).s_ = nulled_e;
  return this;
}

Assistant:

virtual nullable_omittable_field &operator=(nulled_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::nulled_e;
        return *this;
    }